

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall ncnn::Net::load_param(Net *this,uchar *_mem)

{
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  pointer pBVar4;
  uint *puVar5;
  Layer *pLVar6;
  int iVar7;
  Layer *pLVar8;
  long lVar9;
  char *__ptr;
  ulong uVar10;
  ulong uVar11;
  size_t sStack_610;
  int local_604;
  uint *local_600;
  Net *local_5f8;
  int local_5ec;
  uchar *local_5e8;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_5e0;
  Layer *local_5d8;
  ParamDict pd;
  
  local_5f8 = this;
  if (((ulong)_mem & 3) == 0) {
    if (*(int *)_mem == 0x7685dd) {
      local_5ec = *(int *)(_mem + 4);
      iVar7 = *(int *)(_mem + 8);
      local_600 = (uint *)(_mem + 0xc);
      local_5e0 = &this->layers;
      local_5e8 = _mem;
      std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_5e0,(long)local_5ec);
      this_00 = &this->blobs;
      std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize(this_00,(long)iVar7);
      ParamDict::ParamDict(&pd);
      local_604 = 0;
      do {
        if (local_5ec <= local_604) {
          iVar7 = (int)local_600 - (int)local_5e8;
LAB_00117bb3:
          ParamDict::~ParamDict(&pd);
          return iVar7;
        }
        uVar1 = *local_600;
        uVar2 = local_600[1];
        uVar3 = local_600[2];
        local_600 = local_600 + 3;
        pLVar8 = create_layer(uVar1);
        if ((pLVar8 == (Layer *)0x0) &&
           (pLVar8 = create_custom_layer(local_5f8,uVar1 & 0xfffffeff), pLVar8 == (Layer *)0x0)) {
          fprintf(_stderr,"layer %d not exists or registered\n",(ulong)uVar1);
          clear(local_5f8);
          iVar7 = -1;
          goto LAB_00117bb3;
        }
        std::vector<int,_std::allocator<int>_>::resize(&pLVar8->bottoms,(long)(int)uVar2);
        uVar10 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar10 = 0;
        }
        local_5d8 = pLVar8;
        for (uVar11 = 0; pLVar6 = local_5d8, uVar10 != uVar11; uVar11 = uVar11 + 1) {
          uVar1 = *local_600;
          local_600 = local_600 + 1;
          std::vector<int,_std::allocator<int>_>::push_back
                    (&(this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl
                      .super__Vector_impl_data._M_start[(int)uVar1].consumers,&local_604);
          (pLVar8->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11] = uVar1;
        }
        this_01 = &local_5d8->tops;
        std::vector<int,_std::allocator<int>_>::resize(this_01,(long)(int)uVar3);
        puVar5 = local_600;
        pBVar4 = (this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar10 = 0;
        }
        for (lVar9 = 0; uVar10 * 4 != lVar9; lVar9 = lVar9 + 4) {
          local_600 = (uint *)((int *)((long)puVar5 + lVar9) + 1);
          iVar7 = *(int *)((long)puVar5 + lVar9);
          pBVar4[iVar7].producer = local_604;
          *(int *)((long)(this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar9) = iVar7;
        }
        iVar7 = ParamDict::load_param(&pd,(uchar **)&local_600);
        if (iVar7 == 0) {
          iVar7 = (*pLVar6->_vptr_Layer[2])(pLVar6,&pd);
          if (iVar7 != 0) {
            __ptr = "layer load_param failed\n";
            sStack_610 = 0x18;
            goto LAB_00117ba0;
          }
          (local_5e0->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
          super__Vector_impl_data._M_start[local_604] = pLVar6;
        }
        else {
          __ptr = "ParamDict load_param failed\n";
          sStack_610 = 0x1c;
LAB_00117ba0:
          fwrite(__ptr,sStack_610,1,_stderr);
        }
        local_604 = local_604 + 1;
      } while( true );
    }
    fwrite("param is too old, please regenerate\n",0x24,1,_stderr);
  }
  else {
    fprintf(_stderr,"memory not 32-bit aligned at %p\n");
  }
  return -1;
}

Assistant:

int Net::load_param(const unsigned char* _mem)
{
    if ((unsigned long)_mem & 0x3)
    {
        // reject unaligned memory
        fprintf(stderr, "memory not 32-bit aligned at %p\n", _mem);
        return -1;
    }

    const unsigned char* mem = _mem;

    int magic = *(int*)(mem);
    mem += 4;

    if (magic != 7767517)
    {
        fprintf(stderr, "param is too old, please regenerate\n");
        return -1;
    }

    int layer_count = *(int*)(mem);
    mem += 4;

    int blob_count = *(int*)(mem);
    mem += 4;

    layers.resize(layer_count);
    blobs.resize(blob_count);

#if NCNN_VULKAN
    if (use_vulkan_compute && !vkdev)
    {
        // use default vulkan device
        if (!vkdev_local)
            vkdev_local = new VulkanDevice;
        vkdev = vkdev_local;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i=0; i<layer_count; i++)
    {
        int typeindex = *(int*)mem;
        mem += 4;

        int bottom_count = *(int*)mem;
        mem += 4;

        int top_count = *(int*)mem;
        mem += 4;

        Layer* layer = create_layer(typeindex);
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            fprintf(stderr, "layer %d not exists or registered\n", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (use_vulkan_compute)
            layer->vkdev = vkdev;
#endif // NCNN_VULKAN

//         layer->type = std::string(layer_type);
//         layer->name = std::string(layer_name);
//         fprintf(stderr, "new layer %d\n", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            int bottom_blob_index = *(int*)mem;
            mem += 4;

            Blob& blob = blobs[bottom_blob_index];

            blob.consumers.push_back(i);

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            int top_blob_index = *(int*)mem;
            mem += 4;

            Blob& blob = blobs[top_blob_index];

//             blob.name = std::string(blob_name);
//             fprintf(stderr, "new blob %s\n", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        // layer specific params
        int pdlr = pd.load_param(mem);
        if (pdlr != 0)
        {
            fprintf(stderr, "ParamDict load_param failed\n");
            continue;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            fprintf(stderr, "layer load_param failed\n");
            continue;
        }

        layers[i] = layer;
    }

    return mem - _mem;
}